

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

FString __thiscall FString::operator+(FString *this,char tail)

{
  void *__src;
  FStringData *pFVar1;
  undefined1 in_DL;
  ulong uVar2;
  undefined7 in_register_00000031;
  ulong __n;
  
  uVar2 = (ulong)*(uint *)(*(long *)CONCAT71(in_register_00000031,tail) + -0xc);
  pFVar1 = FStringData::Alloc(uVar2 + 1);
  this->Chars = (char *)(pFVar1 + 1);
  pFVar1->Len = (uint)(uVar2 + 1);
  __src = *(void **)CONCAT71(in_register_00000031,tail);
  __n = (ulong)*(uint *)((long)__src + -0xc);
  memcpy(pFVar1 + 1,__src,__n);
  *(undefined1 *)((long)&pFVar1[1].Len + __n) = 0;
  *(undefined1 *)((long)&pFVar1[1].Len + uVar2) = in_DL;
  *(undefined1 *)((long)&pFVar1[1].Len + uVar2 + 1) = 0;
  return (FString)(char *)this;
}

Assistant:

FString FString::operator + (char tail) const
{
	return FString (*this, tail);
}